

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

Bounds2f __thiscall
pbrt::RealisticCamera::BoundExitPupil(RealisticCamera *this,Float filmX0,Float filmX1)

{
  Bounds2f BVar1;
  bool bVar2;
  Ray *in_RDI;
  Float in_XMM0_Da;
  Float FVar3;
  Float FVar4;
  ulong extraout_XMM0_Qb;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  Float in_XMM1_Da;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  Bounds2<float> BVar13;
  Vector3<float> VVar14;
  Ray *in_stack_00000038;
  Ray *in_stack_00000040;
  RealisticCamera *in_stack_00000048;
  Point3f pRear;
  Float u [2];
  Point3f pFilm;
  int i;
  Bounds2f projRearBounds;
  Float rearRadius;
  int nExitingRays;
  int nSamples;
  Bounds2f pupilBounds;
  float in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  Point3<float> *in_stack_fffffffffffffed0;
  Point3<float> *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffeec;
  uint64_t in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  float *in_stack_ffffffffffffff08;
  Bounds2<float> *in_stack_ffffffffffffff10;
  Tuple2<pbrt::Point2,_float> in_stack_ffffffffffffff18;
  Tuple2<pbrt::Point2,_float> in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  Point2<float> local_88 [2];
  Float local_74;
  Float local_70;
  int local_60;
  Float local_4c;
  Float FStack_48;
  Float local_44;
  Float FStack_40;
  Float local_3c;
  int local_38;
  undefined4 local_34;
  Bounds2<float> local_30;
  Float local_20;
  Float local_1c;
  Tuple2<pbrt::Point2,_float> local_10;
  Tuple2<pbrt::Point2,_float> local_8;
  undefined1 auVar9 [56];
  undefined1 extraout_var [56];
  undefined1 auVar12 [56];
  
  local_20 = in_XMM1_Da;
  local_1c = in_XMM0_Da;
  Bounds2<float>::Bounds2
            ((Bounds2<float> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  local_34 = 0x100000;
  local_38 = 0;
  local_3c = RearElementRadius((RealisticCamera *)0x695bbb);
  Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
             in_stack_fffffffffffffec8);
  Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
             in_stack_fffffffffffffec8);
  Bounds2<float>::Bounds2
            ((Bounds2<float> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (Point2<float> *)in_stack_fffffffffffffed8,(Point2<float> *)in_stack_fffffffffffffed0);
  for (local_60 = 0; local_60 < 0x100000; local_60 = local_60 + 1) {
    Lerp(((float)local_60 + 0.5) / 1048576.0,local_1c,local_20);
    Point3<float>::Point3
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8,0.0);
    local_74 = RadicalInverse((int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                              in_stack_fffffffffffffef8);
    local_70 = RadicalInverse((int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                              in_stack_fffffffffffffef8);
    FVar3 = Lerp(local_74,local_4c,local_44);
    FVar4 = Lerp(local_70,FStack_48,FStack_40);
    LensRearZ((RealisticCamera *)0x695d31);
    Point3<float>::Point3
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8,0.0);
    auVar9 = (undefined1  [56])0x0;
    Point2<float>::Point2
              ((Point2<float> *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
               in_stack_fffffffffffffec8);
    bVar2 = Inside<float>(local_88,&local_30);
    in_stack_fffffffffffffeec = CONCAT13(1,(int3)in_stack_fffffffffffffeec);
    if (!bVar2) {
      VVar14 = Point3<float>::operator-
                         ((Point3<float> *)CONCAT44(FVar4,in_stack_fffffffffffffee0),
                          in_stack_fffffffffffffed8);
      auVar5._0_8_ = VVar14.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar5._8_56_ = auVar9;
      in_stack_ffffffffffffff30 = vmovlpd_avx(auVar5._0_16_);
      MediumHandle::TaggedPointer
                ((MediumHandle *)in_stack_fffffffffffffed0,
                 (nullptr_t)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      Ray::Ray(in_RDI,(Point3f *)CONCAT44(in_stack_fffffffffffffeec,FVar3),
               (Vector3f *)CONCAT44(FVar4,in_stack_fffffffffffffee0),
               (Float)((ulong)in_stack_fffffffffffffed8 >> 0x20),
               (MediumHandle *)in_stack_fffffffffffffed0);
      FVar3 = TraceLensesFromFilm(in_stack_00000048,in_stack_00000040,in_stack_00000038);
      in_stack_fffffffffffffeec = CONCAT13(FVar3 != 0.0,(int3)in_stack_fffffffffffffeec);
    }
    if ((char)((uint)in_stack_fffffffffffffeec >> 0x18) != '\0') {
      auVar9 = (undefined1  [56])0x0;
      auVar12 = (undefined1  [56])0x0;
      in_stack_fffffffffffffed8 = (Point3<float> *)&stack0xffffffffffffff10;
      Point2<float>::Point2
                ((Point2<float> *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                 in_stack_fffffffffffffec8);
      BVar13 = Union<float>((Bounds2<float> *)CONCAT44(FVar4,in_stack_fffffffffffffee0),
                            (Point2<float> *)in_stack_fffffffffffffed8);
      auVar10._0_8_ = BVar13.pMax.super_Tuple2<pbrt::Point2,_float>;
      auVar10._8_56_ = auVar12;
      auVar6._0_8_ = BVar13.pMin.super_Tuple2<pbrt::Point2,_float>;
      auVar6._8_56_ = auVar9;
      in_stack_ffffffffffffff18 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar6._0_16_);
      in_stack_ffffffffffffff20 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar10._0_16_);
      local_38 = local_38 + 1;
      local_30.pMin.super_Tuple2<pbrt::Point2,_float> = in_stack_ffffffffffffff18;
      local_30.pMax.super_Tuple2<pbrt::Point2,_float> = in_stack_ffffffffffffff20;
    }
  }
  if (local_38 == 0) {
    if (LOGGING_LogLevel < 1) {
      Log<float&,float&>((LogLevel)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                         in_stack_ffffffffffffff28,(int)in_stack_ffffffffffffff20.y,
                         (char *)in_stack_ffffffffffffff18,(float *)in_stack_ffffffffffffff10,
                         in_stack_ffffffffffffff08);
    }
    local_10.y = FStack_48;
    local_10.x = local_4c;
    local_8.y = FStack_40;
    local_8.x = local_44;
  }
  else {
    auVar7._0_8_ = Bounds2<float>::Diagonal
                             ((Bounds2<float> *)
                              CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    auVar7._8_56_ = extraout_var;
    vmovlpd_avx(auVar7._0_16_);
    Length<float>((Vector2<float> *)0x695f33);
    std::sqrt<int>(0);
    auVar12 = ZEXT856(extraout_XMM0_Qb);
    auVar9 = ZEXT856(0);
    BVar13 = Expand<float,double>(in_stack_ffffffffffffff10,(double)in_stack_ffffffffffffff08);
    auVar11._0_8_ = BVar13.pMax.super_Tuple2<pbrt::Point2,_float>;
    auVar11._8_56_ = auVar12;
    auVar8._0_8_ = BVar13.pMin.super_Tuple2<pbrt::Point2,_float>;
    auVar8._8_56_ = auVar9;
    local_10 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar8._0_16_);
    local_8 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar11._0_16_);
  }
  BVar1.pMax.super_Tuple2<pbrt::Point2,_float> = local_8;
  BVar1.pMin.super_Tuple2<pbrt::Point2,_float> = local_10;
  return BVar1;
}

Assistant:

Bounds2f RealisticCamera::BoundExitPupil(Float filmX0, Float filmX1) const {
    Bounds2f pupilBounds;
    // Sample a collection of points on the rear lens to find exit pupil
    const int nSamples = 1024 * 1024;
    int nExitingRays = 0;
    // Compute bounding box of projection of rear element on sampling plane
    Float rearRadius = RearElementRadius();
    Bounds2f projRearBounds(Point2f(-1.5f * rearRadius, -1.5f * rearRadius),
                            Point2f(1.5f * rearRadius, 1.5f * rearRadius));

    for (int i = 0; i < nSamples; ++i) {
        // Find location of sample points on $x$ segment and rear lens element
        Point3f pFilm(Lerp((i + 0.5f) / nSamples, filmX0, filmX1), 0, 0);
        Float u[2] = {RadicalInverse(0, i), RadicalInverse(1, i)};
        Point3f pRear(Lerp(u[0], projRearBounds.pMin.x, projRearBounds.pMax.x),
                      Lerp(u[1], projRearBounds.pMin.y, projRearBounds.pMax.y),
                      LensRearZ());

        // Expand pupil bounds if ray makes it through the lens system
        if (Inside(Point2f(pRear.x, pRear.y), pupilBounds) ||
            TraceLensesFromFilm(Ray(pFilm, pRear - pFilm), nullptr)) {
            pupilBounds = Union(pupilBounds, Point2f(pRear.x, pRear.y));
            ++nExitingRays;
        }
    }

    // Return entire element bounds if no rays made it through the lens system
    if (nExitingRays == 0) {
        LOG_VERBOSE("Unable to find exit pupil in x = [%f,%f] on film.", filmX0, filmX1);
        return projRearBounds;
    }

    // Expand bounds to account for sample spacing
    pupilBounds =
        Expand(pupilBounds, 2 * Length(projRearBounds.Diagonal()) / std::sqrt(nSamples));

    return pupilBounds;
}